

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  byte *pbVar1;
  int *piVar2;
  int iVar3;
  ImGuiDockContext *this;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar4;
  ImGuiDockRequest *pIVar5;
  char *pcVar6;
  ImGuiContext *ctx;
  ImGuiDockNode *dst_node;
  long lVar7;
  void *__dest;
  char *pcVar8;
  ushort uVar9;
  uint uVar10;
  ImGuiDockNode *pIVar11;
  ushort uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  long lVar16;
  uint uVar17;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  uint local_68;
  uint uStack_64;
  void *pvStack_60;
  
  ctx = GImGui;
  this = GImGui->DockContext;
  if (root_id == 0) {
    dst_node = (ImGuiDockNode *)0x0;
  }
  else {
    dst_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,root_id);
    if (dst_node == (ImGuiDockNode *)0x0) {
      return;
    }
  }
  if (dst_node == (ImGuiDockNode *)0x0) {
    uVar9 = 0;
    uVar12 = 0;
  }
  else {
    uVar9 = *(ushort *)&dst_node->field_0xb0 & 7;
    uVar12 = *(ushort *)&dst_node->field_0xb0 & 0x38;
  }
  local_68 = 0;
  uStack_64 = 0;
  pvStack_60 = (void *)0x0;
  if ((this->Nodes).Data.Size < 1) {
    bVar15 = false;
  }
  else {
    lVar16 = 0;
    bVar15 = false;
    do {
      src_node = (ImGuiDockNode *)(this->Nodes).Data.Data[lVar16].field_1.val_p;
      if (src_node != (ImGuiDockNode *)0x0) {
        if (root_id == 0) {
LAB_001664a4:
          if ((src_node->LocalFlags & 0x800) != 0) {
            bVar15 = true;
          }
          if (root_id != 0) {
            lVar7 = (long)(ctx->DockContext->Requests).Size;
            if (0 < lVar7) {
              pIVar5 = (ctx->DockContext->Requests).Data;
              lVar13 = 0;
              do {
                if (*(ImGuiDockNode **)((long)&pIVar5->DockTargetNode + lVar13) == src_node) {
                  *(undefined4 *)((long)&pIVar5->Type + lVar13) = 0;
                }
                lVar13 = lVar13 + 0x40;
              } while (lVar7 * 0x40 != lVar13);
            }
          }
          if (dst_node != (ImGuiDockNode *)0x0) {
            DockNodeMoveWindows(dst_node,src_node);
          }
          __dest = pvStack_60;
          if (local_68 == uStack_64) {
            if (uStack_64 == 0) {
              uVar10 = 8;
            }
            else {
              uVar10 = (int)uStack_64 / 2 + uStack_64;
            }
            uVar17 = local_68 + 1;
            if ((int)(local_68 + 1) < (int)uVar10) {
              uVar17 = uVar10;
            }
            if ((int)uStack_64 < (int)uVar17) {
              if (GImGui != (ImGuiContext *)0x0) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + 1;
              }
              __dest = (*GImAllocatorAllocFunc)((long)(int)uVar17 << 3,GImAllocatorUserData);
              uStack_64 = uVar17;
              if (pvStack_60 != (void *)0x0) {
                memcpy(__dest,pvStack_60,(long)(int)local_68 << 3);
                if ((pvStack_60 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + -1;
                }
                (*GImAllocatorFreeFunc)(pvStack_60,GImAllocatorUserData);
              }
            }
          }
          pvStack_60 = __dest;
          *(ImGuiDockNode **)((long)pvStack_60 + (long)(int)local_68 * 8) = src_node;
          local_68 = local_68 + 1;
        }
        else {
          pIVar4 = src_node;
          if (src_node->ID != root_id) {
            do {
              pIVar11 = pIVar4;
              pIVar4 = pIVar11->ParentNode;
            } while (pIVar4 != (ImGuiDockNode *)0x0);
            if (pIVar11->ID == root_id) goto LAB_001664a4;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->Nodes).Data.Size);
  }
  if (dst_node != (ImGuiDockNode *)0x0) {
    *(ushort *)&dst_node->field_0xb0 =
         uVar12 | uVar9 | (ushort)*(undefined4 *)&dst_node->field_0xb0 & 0xffc0;
  }
  pcVar6 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar6 != (char *)0x0) {
    iVar3 = (ctx->SettingsWindows).Buf.Size;
    pcVar8 = pcVar6 + 4;
    do {
      if (*(int *)(pcVar8 + 0x14) != 0 && 0 < (int)local_68) {
        uVar14 = 0;
        do {
          if (**(int **)((long)pvStack_60 + uVar14 * 8) == *(int *)(pcVar8 + 0x14)) {
            *(ImGuiID *)(pcVar8 + 0x14) = root_id;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (local_68 != uVar14);
      }
      pcVar8 = pcVar8 + *(int *)(pcVar8 + -4);
    } while (pcVar8 != pcVar6 + (long)iVar3 + 4);
  }
  if (1 < (long)(int)local_68) {
    qsort(pvStack_60,(long)(int)local_68,8,DockNodeComparerDepthMostFirst);
  }
  if (0 < (int)local_68) {
    lVar16 = 0;
    do {
      DockContextRemoveNode(ctx,*(ImGuiDockNode **)((long)pvStack_60 + lVar16 * 8),false);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)local_68);
  }
  if (root_id == 0) {
    ImGuiStorage::Clear(&this->Nodes);
    pIVar5 = (this->Requests).Data;
    if (pIVar5 != (ImGuiDockRequest *)0x0) {
      (this->Requests).Size = 0;
      (this->Requests).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (this->Requests).Data = (ImGuiDockRequest *)0x0;
    }
  }
  else if (bVar15) {
    pbVar1 = (byte *)((long)&dst_node->LocalFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    dst_node->CentralNode = dst_node;
  }
  if (pvStack_60 != (void *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(pvStack_60,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc = ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}